

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test1::GPUShaderFP64Test1(GPUShaderFP64Test1 *this,Context *context)

{
  Context *context_local;
  GPUShaderFP64Test1 *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"errors",
             "Verifies that various erroneous conditions related to double-precision float uniform support & glUniform*() / glUniformMatrix*() API  are reported correctly."
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GPUShaderFP64Test1_0322ded0;
  this->m_has_test_passed = true;
  this->m_po_bool_arr_uniform_location = 0;
  this->m_po_bool_uniform_location = 0;
  this->m_po_bvec2_arr_uniform_location = 0;
  this->m_po_bvec2_uniform_location = 0;
  this->m_po_bvec3_arr_uniform_location = 0;
  this->m_po_bvec3_uniform_location = 0;
  this->m_po_bvec4_arr_uniform_location = 0;
  this->m_po_bvec4_uniform_location = 0;
  this->m_po_dmat2_arr_uniform_location = 0;
  this->m_po_dmat2_uniform_location = 0;
  this->m_po_dmat2x3_arr_uniform_location = 0;
  this->m_po_dmat2x3_uniform_location = 0;
  this->m_po_dmat2x4_arr_uniform_location = 0;
  this->m_po_dmat2x4_uniform_location = 0;
  this->m_po_dmat3_arr_uniform_location = 0;
  this->m_po_dmat3_uniform_location = 0;
  this->m_po_dmat3x2_arr_uniform_location = 0;
  this->m_po_dmat3x2_uniform_location = 0;
  this->m_po_dmat3x4_arr_uniform_location = 0;
  this->m_po_dmat3x4_uniform_location = 0;
  this->m_po_dmat4_arr_uniform_location = 0;
  this->m_po_dmat4_uniform_location = 0;
  this->m_po_dmat4x2_arr_uniform_location = 0;
  this->m_po_dmat4x2_uniform_location = 0;
  this->m_po_dmat4x3_arr_uniform_location = 0;
  this->m_po_dmat4x3_uniform_location = 0;
  this->m_po_double_arr_uniform_location = 0;
  this->m_po_double_uniform_location = 0;
  this->m_po_dvec2_arr_uniform_location = 0;
  this->m_po_dvec2_uniform_location = 0;
  this->m_po_dvec3_arr_uniform_location = 0;
  this->m_po_dvec3_uniform_location = 0;
  this->m_po_dvec4_arr_uniform_location = 0;
  this->m_po_dvec4_uniform_location = 0;
  this->m_po_float_arr_uniform_location = 0;
  this->m_po_float_uniform_location = 0;
  this->m_po_int_arr_uniform_location = 0;
  this->m_po_int_uniform_location = 0;
  this->m_po_ivec2_arr_uniform_location = 0;
  this->m_po_ivec2_uniform_location = 0;
  this->m_po_ivec3_arr_uniform_location = 0;
  this->m_po_ivec3_uniform_location = 0;
  this->m_po_ivec4_arr_uniform_location = 0;
  this->m_po_ivec4_uniform_location = 0;
  this->m_po_sampler_uniform_location = 0;
  this->m_po_uint_arr_uniform_location = 0;
  this->m_po_uint_uniform_location = 0;
  this->m_po_uvec2_arr_uniform_location = 0;
  this->m_po_uvec2_uniform_location = 0;
  this->m_po_uvec3_arr_uniform_location = 0;
  this->m_po_uvec3_uniform_location = 0;
  this->m_po_uvec4_arr_uniform_location = 0;
  this->m_po_uvec4_uniform_location = 0;
  this->m_po_vec2_arr_uniform_location = 0;
  this->m_po_vec2_uniform_location = 0;
  this->m_po_vec3_arr_uniform_location = 0;
  this->m_po_vec3_uniform_location = 0;
  this->m_po_vec4_arr_uniform_location = 0;
  this->m_po_vec4_uniform_location = 0;
  this->m_po_id = 0;
  this->m_vs_id = 0;
  return;
}

Assistant:

GPUShaderFP64Test1::GPUShaderFP64Test1(deqp::Context& context)
	: TestCase(context, "errors", "Verifies that various erroneous conditions related to double-precision "
								  "float uniform support & glUniform*() / glUniformMatrix*() API "
								  " are reported correctly.")
	, m_has_test_passed(true)
	, m_po_bool_arr_uniform_location(0)
	, m_po_bool_uniform_location(0)
	, m_po_bvec2_arr_uniform_location(0)
	, m_po_bvec2_uniform_location(0)
	, m_po_bvec3_arr_uniform_location(0)
	, m_po_bvec3_uniform_location(0)
	, m_po_bvec4_arr_uniform_location(0)
	, m_po_bvec4_uniform_location(0)
	, m_po_dmat2_arr_uniform_location(0)
	, m_po_dmat2_uniform_location(0)
	, m_po_dmat2x3_arr_uniform_location(0)
	, m_po_dmat2x3_uniform_location(0)
	, m_po_dmat2x4_arr_uniform_location(0)
	, m_po_dmat2x4_uniform_location(0)
	, m_po_dmat3_arr_uniform_location(0)
	, m_po_dmat3_uniform_location(0)
	, m_po_dmat3x2_arr_uniform_location(0)
	, m_po_dmat3x2_uniform_location(0)
	, m_po_dmat3x4_arr_uniform_location(0)
	, m_po_dmat3x4_uniform_location(0)
	, m_po_dmat4_arr_uniform_location(0)
	, m_po_dmat4_uniform_location(0)
	, m_po_dmat4x2_arr_uniform_location(0)
	, m_po_dmat4x2_uniform_location(0)
	, m_po_dmat4x3_arr_uniform_location(0)
	, m_po_dmat4x3_uniform_location(0)
	, m_po_double_arr_uniform_location(0)
	, m_po_double_uniform_location(0)
	, m_po_dvec2_arr_uniform_location(0)
	, m_po_dvec2_uniform_location(0)
	, m_po_dvec3_arr_uniform_location(0)
	, m_po_dvec3_uniform_location(0)
	, m_po_dvec4_arr_uniform_location(0)
	, m_po_dvec4_uniform_location(0)
	, m_po_float_arr_uniform_location(0)
	, m_po_float_uniform_location(0)
	, m_po_int_arr_uniform_location(0)
	, m_po_int_uniform_location(0)
	, m_po_ivec2_arr_uniform_location(0)
	, m_po_ivec2_uniform_location(0)
	, m_po_ivec3_arr_uniform_location(0)
	, m_po_ivec3_uniform_location(0)
	, m_po_ivec4_arr_uniform_location(0)
	, m_po_ivec4_uniform_location(0)
	, m_po_sampler_uniform_location(0)
	, m_po_uint_arr_uniform_location(0)
	, m_po_uint_uniform_location(0)
	, m_po_uvec2_arr_uniform_location(0)
	, m_po_uvec2_uniform_location(0)
	, m_po_uvec3_arr_uniform_location(0)
	, m_po_uvec3_uniform_location(0)
	, m_po_uvec4_arr_uniform_location(0)
	, m_po_uvec4_uniform_location(0)
	, m_po_vec2_arr_uniform_location(0)
	, m_po_vec2_uniform_location(0)
	, m_po_vec3_arr_uniform_location(0)
	, m_po_vec3_uniform_location(0)
	, m_po_vec4_arr_uniform_location(0)
	, m_po_vec4_uniform_location(0)
	, m_po_id(0)
	, m_vs_id(0)
{
	/* Left blank intentionally */
}